

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

int run_test_condvar_5(void)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint64_t timeout;
  uint64_t elapsed;
  uint64_t after;
  uint64_t before;
  undefined1 local_c0 [4];
  int r;
  worker_config_conflict wc;
  undefined4 uVar6;
  
  worker_config_init((worker_config_conflict *)local_c0,0,(signal_func)0x0,(wait_func)0x0);
  uv_mutex_lock((uv_mutex_t *)((long)&wc.sem_signaled + 0x18));
  uVar2 = uv_hrtime();
  iVar1 = uv_cond_timedwait((uv_cond_t *)((long)&wc.mutex + 0x20),
                            (uv_mutex_t *)((long)&wc.sem_signaled + 0x18),100000000);
  uVar3 = uv_hrtime();
  uv_mutex_unlock((uv_mutex_t *)((long)&wc.sem_signaled + 0x18));
  if (iVar1 != -0x6e) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
            ,0xfe,"r == UV_ETIMEDOUT");
    abort();
  }
  lVar4 = uVar3 - uVar2;
  auVar7._0_12_ = ZEXT812(100000000);
  auVar7._12_4_ = 0x45300000;
  uVar6 = (undefined4)((ulong)lVar4 >> 0x20);
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  if ((auVar5._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) <
      ((auVar7._8_8_ - 1.9342813113834067e+25) + 100000000.0) * 0.75) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
            ,0x105,"0.75 * timeout <= elapsed");
    abort();
  }
  auVar8._8_4_ = uVar6;
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  auVar9._0_12_ = ZEXT812(100000000);
  auVar9._12_4_ = 0x45300000;
  if (((auVar9._8_8_ - 1.9342813113834067e+25) + 100000000.0) * 5.0 <
      (auVar8._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
            ,0x106,"elapsed <= 5.0 * timeout");
    abort();
  }
  worker_config_destroy((worker_config_conflict *)local_c0);
  return 0;
}

Assistant:

TEST_IMPL(condvar_5) {
  worker_config wc;
  int r;
  /* ns */
  uint64_t before;
  uint64_t after;
  uint64_t elapsed;
  uint64_t timeout;

  timeout = 100 * 1000 * 1000; /* 100 ms in ns */

  /* Mostly irrelevant. We need cond and mutex initialized. */
  worker_config_init(&wc, 0, NULL, NULL);

  uv_mutex_lock(&wc.mutex);

  /* We wait.
   * No signaler, so this will only return if timeout is delivered. */
  before = uv_hrtime();
  r = uv_cond_timedwait(&wc.cond, &wc.mutex, timeout);
  after = uv_hrtime();

  uv_mutex_unlock(&wc.mutex);

  /* It timed out. */
  ASSERT(r == UV_ETIMEDOUT);

  /* It must have taken at least timeout, modulo system timer ticks.
   * But it should not take too much longer.
   * cf. MSDN docs:
   * https://msdn.microsoft.com/en-us/library/ms687069(VS.85).aspx */
  elapsed = after - before;
  ASSERT(0.75 * timeout <= elapsed); /* 1.0 too large for Windows. */
  ASSERT(elapsed <= 5.0 * timeout); /* MacOS has reported failures up to 1.75. */

  worker_config_destroy(&wc);

  return 0;
}